

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O0

int cmn_set_repr(cmn_t *cmn,char *repr)

{
  char *pcVar1;
  bool bVar2;
  double dVar3;
  int local_34;
  int32 nvals;
  char *vallist;
  char *cc;
  char *c;
  char *repr_local;
  cmn_t *cmn_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x7c,"Update from < %s >\n",cmn->repr);
  memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
  memset(cmn->sum,0,(long)cmn->veclen << 2);
  pcVar1 = __ckd_salloc__(repr,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x7f);
  local_34 = 0;
  cc = pcVar1;
  while( true ) {
    bVar2 = false;
    if (local_34 < cmn->veclen) {
      vallist = strchr(cc,0x2c);
      bVar2 = vallist != (char *)0x0;
    }
    if (!bVar2) break;
    *vallist = '\0';
    dVar3 = atof_c(cc);
    cmn->cmn_mean[local_34] = (mfcc_t)(float)dVar3;
    cmn->sum[local_34] = (mfcc_t)((float)cmn->cmn_mean[local_34] * 500.0);
    cc = vallist + 1;
    local_34 = local_34 + 1;
  }
  if ((local_34 < cmn->veclen) && (*cc != '\0')) {
    dVar3 = atof_c(cc);
    cmn->cmn_mean[local_34] = (mfcc_t)(float)dVar3;
    cmn->sum[local_34] = (mfcc_t)((float)cmn->cmn_mean[local_34] * 500.0);
  }
  ckd_free(pcVar1);
  cmn->nframe = 500;
  pcVar1 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x90,"Update to   < %s >\n",pcVar1);
  return 0;
}

Assistant:

int
cmn_set_repr(cmn_t *cmn, const char *repr)
{
    char *c, *cc, *vallist;
    int32 nvals;

    E_INFO("Update from < %s >\n", cmn->repr);
    memset(cmn->cmn_mean, 0, sizeof(cmn->cmn_mean[0]) * cmn->veclen);
    memset(cmn->sum, 0, sizeof(cmn->sum[0]) * cmn->veclen);
    vallist = ckd_salloc(repr);
    c = vallist;
    nvals = 0;
    while (nvals < cmn->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
        c = cc + 1;
        ++nvals;
    }
    if (nvals < cmn->veclen && *c != '\0') {
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
    }
    ckd_free(vallist);
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
    return 0;
}